

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_gold_rewards_handling.hpp
# Opt level: O2

void __thiscall
PatchImproveGoldRewardsHandling::inject_data
          (PatchImproveGoldRewardsHandling *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  Item *pIVar2;
  long lVar3;
  allocator<char> local_69;
  ByteArray byte_array;
  string local_48;
  
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  for (lVar3 = -0x30; lVar3 != 0; lVar3 = lVar3 + 1) {
    pIVar2 = World::item(world,(char)lVar3 + 'p');
    ByteArray::add_byte(&byte_array,(uint8_t)pIVar2->_gold_value);
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"",&local_69);
  uVar1 = md::ROM::inject_bytes
                    (rom,&byte_array.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                     &local_48);
  this->_gold_rewards_table_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&byte_array);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        ByteArray byte_array;
        for(size_t id=ITEM_GOLDS_START ; id < ITEM_GOLDS_END ; ++id)
        {
            try {
                Item* gold_item = world.item(id);
                byte_array.add_byte(static_cast<uint8_t>(gold_item->gold_value()));
            } catch(std::out_of_range&) {
                break;
            }
        }

        _gold_rewards_table_addr = rom.inject_bytes(byte_array);
    }